

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.c
# Opt level: O0

_Bool duckdb_je_counter_accum_init(counter_accum_t *counter,uint64_t interval)

{
  uint64_t in_RSI;
  locked_u64_t *in_RDI;
  
  locked_init_u64_unsynchronized(in_RDI,0);
  in_RDI[1].val.repr = in_RSI;
  return false;
}

Assistant:

bool
counter_accum_init(counter_accum_t *counter, uint64_t interval) {
	if (LOCKEDINT_MTX_INIT(counter->mtx, "counter_accum",
	    WITNESS_RANK_COUNTER_ACCUM, malloc_mutex_rank_exclusive)) {
		return true;
	}
	locked_init_u64_unsynchronized(&counter->accumbytes, 0);
	counter->interval = interval;
	return false;
}